

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O2

void __thiscall
dgList<dgConvexHull3DFace>::Unlink(dgList<dgConvexHull3DFace> *this,dgListNode *node)

{
  int iVar1;
  
  if (node == (dgListNode *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgList.h"
                  ,0x227,
                  "void dgList<dgConvexHull3DFace>::Unlink(dgListNode *const) [T = dgConvexHull3DFace]"
                 );
  }
  iVar1 = this->m_count;
  this->m_count = iVar1 + -1;
  if (0 < iVar1) {
    if (this->m_first == node) {
      this->m_first = this->m_first->m_next;
    }
    if (this->m_last == node) {
      this->m_last = this->m_last->m_prev;
    }
    dgListNode::Unlink(node);
    return;
  }
  __assert_fail("m_count >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgList.h"
                ,0x22a,
                "void dgList<dgConvexHull3DFace>::Unlink(dgListNode *const) [T = dgConvexHull3DFace]"
               );
}

Assistant:

void dgList<T>::Unlink (dgListNode* const node)
{
	HACD_ASSERT (node);

	m_count --;
	HACD_ASSERT (m_count >= 0);

	if (node == m_first) {
		m_first = m_first->GetNext();
	}
	if (node == m_last) {
		m_last = m_last->GetPrev();
	}
//	node->Remove();
	node->Unlink();

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif
}